

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

int process_ret_type(c2m_ctx_t c2m_ctx,type *ret_type,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  int iVar2;
  int local_44;
  int local_40;
  int n_qwords;
  int curr;
  int n_stregs;
  int n_fregs;
  int n_iregs;
  int n;
  MIR_type_t type;
  MIR_type_t *qword_types_local;
  type *ret_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  local_44 = classify_arg(c2m_ctx,ret_type,qword_types,0);
  if ((ret_type->mode == TM_STRUCT) || (ret_type->mode == TM_UNION)) {
    if (local_44 != 0) {
      update_last_qword_type(c2m_ctx,ret_type,qword_types,local_44);
      local_40 = 0;
      n_qwords = 0;
      curr = 0;
      n_stregs = 0;
      for (n_fregs = 0; n_fregs < local_44; n_fregs = n_fregs + 1) {
        MVar1 = qword_types[n_fregs];
        iVar2 = local_40 + 1;
        qword_types[local_40] = MVar1;
        switch(MVar1) {
        case MIR_T_I8:
        case MIR_T_I16:
        case MIR_T_I32:
        case MIR_T_I64:
          n_stregs = n_stregs + 1;
          local_40 = iVar2;
          break;
        default:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0xa6,"int process_ret_type(c2m_ctx_t, struct type *, MIR_type_t *)");
        case MIR_T_F:
        case MIR_T_D:
          curr = curr + 1;
          local_40 = iVar2;
          break;
        case MIR_T_LD:
          n_qwords = n_qwords + 1;
          local_40 = iVar2;
          break;
        case 0x15:
          local_44 = local_44 + -1;
        }
      }
      if (((2 < n_stregs) || (2 < curr)) || (1 < n_qwords)) {
        local_44 = 0;
      }
    }
    c2m_ctx_local._4_4_ = local_44;
  }
  else {
    c2m_ctx_local._4_4_ = 0;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int process_ret_type (c2m_ctx_t c2m_ctx, struct type *ret_type,
                             MIR_type_t qword_types[MAX_QWORDS]) {
  MIR_type_t type;
  int n, n_iregs, n_fregs, n_stregs, curr;
  int n_qwords = classify_arg (c2m_ctx, ret_type, qword_types, FALSE);

  if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) return 0;
  if (n_qwords != 0) {
    update_last_qword_type (c2m_ctx, ret_type, qword_types, n_qwords);
    n_iregs = n_fregs = n_stregs = curr = 0;
    for (n = 0; n < n_qwords; n++) { /* start from the last qword */
      type = qword_types[n];
      qword_types[curr++] = type;
      switch ((int) type) {
      case MIR_T_I8:
      case MIR_T_I16:
      case MIR_T_I32:
      case MIR_T_I64: n_iregs++; break;
      case MIR_T_F:
      case MIR_T_D: n_fregs++; break;
      case MIR_T_LD: n_stregs++; break;
      case X87UP_CLASS:
        n_qwords--;
        curr--;
        break;
      default: assert (FALSE);
      }
    }
    if (n_iregs > 2 || n_fregs > 2 || n_stregs > 1) n_qwords = 0;
  }
  return n_qwords;
}